

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

void restore_food(memfile *mf,level *lev)

{
  byte bVar1;
  uint uVar2;
  int32_t iVar3;
  
  uVar2 = mread32(mf);
  if (uVar2 == 0) {
    victual.piece = (obj *)0x0;
  }
  else {
    victual.piece = find_oid(lev,uVar2);
  }
  victual.usedtime = mread32(mf);
  victual.reqtime = mread32(mf);
  victual.nmod = mread32(mf);
  iVar3 = mread32(mf);
  bVar1 = (byte)((uint)iVar3 >> 0x18);
  victual._20_1_ =
       bVar1 >> 1 & 8 | bVar1 >> 3 & 4 | bVar1 >> 5 & 2 | victual._20_1_ & 0xf0 | bVar1 >> 7;
  uVar2 = mread32(mf);
  if (uVar2 == 0) {
    tin.tin = (obj *)0x0;
  }
  else {
    tin.tin = find_oid(lev,uVar2);
  }
  tin.usedtime = mread32(mf);
  tin.reqtime = mread32(mf);
  return;
}

Assistant:

void restore_food(struct memfile *mf, struct level *lev)
{
    unsigned int oid, vflags;
    oid = mread32(mf);
    victual.piece = oid ? find_oid(lev, oid) : NULL;
    victual.usedtime = mread32(mf);
    victual.reqtime = mread32(mf);
    victual.nmod = mread32(mf);

    vflags = mread32(mf);
    victual.canchoke = (vflags >> 31) & 1;
    victual.fullwarn = (vflags >> 30) & 1;
    victual.eating   = (vflags >> 29) & 1;
    victual.doreset  = (vflags >> 28) & 1;

    oid = mread32(mf);
    tin.tin = oid ? find_oid(lev, oid) : NULL;
    tin.usedtime = mread32(mf);
    tin.reqtime = mread32(mf);
}